

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_int>
          (TryCast *this,string_t input,uint32_t *result,bool strict)

{
  idx_t pos;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  byte bVar9;
  char cVar10;
  long lVar11;
  undefined4 uVar12;
  ulong uVar13;
  byte bVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  idx_t iVar18;
  bool bVar19;
  ExponentData exponent;
  byte local_88;
  IntegerDecimalCastData<unsigned_int> local_78;
  uint *local_58;
  undefined4 local_4c;
  ulong local_48;
  string_t input_local;
  
  local_58 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar15 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar15 = input_local.value.pointer.prefix;
  }
  uVar5 = (ulong)this & 0xffffffff;
  uVar17 = 0;
  while( true ) {
    uVar7 = uVar5 - uVar17;
    local_88 = (byte)result;
    input_local.value._0_8_ = this;
    if (uVar7 == 0) break;
    bVar14 = pcVar15[uVar17];
    if ((4 < bVar14 - 9) && (bVar14 != 0x20)) {
      if (bVar14 == 0x2d) {
        uVar1 = uVar5 - uVar17;
        uVar7 = 1;
        goto LAB_0164a735;
      }
      if ((uVar5 - 1 == uVar17) || (bVar14 != 0x30)) {
        if ((local_88 & bVar14 == 0x2b) == 0) {
          uVar16 = (uint)(bVar14 == 0x2b);
LAB_0164a93f:
          uVar13 = (ulong)uVar16;
          uVar16 = 0;
          uVar1 = uVar13;
          goto LAB_0164a94f;
        }
        break;
      }
      cVar10 = pcVar15[uVar17 + 1];
      if (cVar10 == 'B') {
LAB_0164aa2c:
        uVar7 = ~uVar17 + uVar5;
        uVar13 = 1;
        uVar16 = 0;
        goto LAB_0164aa3e;
      }
      if (cVar10 != 'x') {
        if (cVar10 == 'b') goto LAB_0164aa2c;
        if (cVar10 != 'X') {
          if ((local_88 & (byte)(cVar10 - 0x30U) < 10) == 0) {
            uVar16 = 0;
            goto LAB_0164a93f;
          }
          break;
        }
      }
      local_48 = ~uVar17 + uVar5;
      uVar16 = 0;
      uVar13 = 1;
      goto LAB_0164a7ac;
    }
    uVar17 = uVar17 + 1;
  }
  goto LAB_0164abee;
LAB_0164a89f:
  uVar13 = uVar7;
  if (uVar1 <= uVar13) goto joined_r0x0164abe1;
  bVar14 = pcVar15[uVar17 + uVar13];
  if (9 < (byte)(bVar14 - 0x30)) {
    if (bVar14 == 0x2e) {
      if (local_88 != 0) goto LAB_0164abee;
      if (uVar1 <= uVar13 + 1) goto joined_r0x0164abe1;
      if ((uVar13 < 2) ||
         (bVar14 = pcVar15[uVar17 + 1 + uVar13], uVar13 = uVar13 + 1, (byte)(bVar14 - 0x30) < 10))
      goto LAB_0164abee;
    }
    if ((bVar14 < 0x21) && ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
      uVar7 = uVar13 + 1;
      uVar13 = uVar7;
      if (uVar7 < uVar1) {
        uVar13 = uVar1;
      }
      goto LAB_0164ab43;
    }
    goto LAB_0164abee;
  }
  uVar16 = uVar16 * 10 - (uint)(byte)(bVar14 - 0x30);
  uVar7 = uVar1;
  if (((~uVar13 + uVar5 != uVar17) &&
      (uVar7 = uVar13 + 1, pcVar15[uVar17 + 1 + uVar13] == '_' && local_88 == 0)) &&
     (((uVar5 - uVar13) - 2 == uVar17 ||
      (uVar7 = uVar13 + 2, 9 < (byte)(pcVar15[uVar17 + 2 + uVar13] - 0x30U))))) goto LAB_0164abee;
  goto LAB_0164a89f;
LAB_0164ab43:
  if (uVar1 <= uVar7) goto joined_r0x0164abe1;
  if ((0x20 < (ulong)(byte)pcVar15[uVar17 + uVar7]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar7] & 0x3f) & 1) == 0)) goto LAB_0164abee;
  uVar7 = uVar7 + 1;
  goto LAB_0164ab43;
LAB_0164aa3e:
  if (uVar7 <= uVar13) goto joined_r0x0164abe1;
  iVar8 = 0;
  if (pcVar15[uVar17 + 1 + uVar13] != '0') {
    if (pcVar15[uVar17 + 1 + uVar13] != '1') goto LAB_0164abee;
    iVar8 = 1;
  }
  uVar1 = uVar7;
  if ((uVar5 - uVar13) - 2 != uVar17) {
    if (pcVar15[uVar17 + 2 + uVar13] == '_') {
      if (((uVar5 - uVar13) - 3 == uVar17) || ((pcVar15[uVar17 + 3 + uVar13] & 0xfeU) != 0x30))
      goto LAB_0164abee;
      uVar1 = uVar13 + 2;
    }
    else {
      uVar1 = uVar13 + 1;
    }
  }
  uVar13 = uVar1;
  if ((int)uVar16 < 0) goto LAB_0164abee;
  uVar16 = iVar8 + uVar16 * 2;
  goto LAB_0164aa3e;
LAB_0164a94f:
  uVar2 = uVar1;
  if (uVar7 <= uVar2) goto LAB_0164aacc;
  bVar14 = pcVar15[uVar17 + uVar2];
  bVar9 = bVar14 - 0x30;
  if (9 < bVar9) {
    if (bVar14 == 0x2e) {
      if (local_88 != 0) goto LAB_0164abee;
      uVar1 = uVar2 + 1;
      if (uVar7 <= uVar1) {
        bVar19 = uVar13 < uVar2;
        uVar2 = uVar1;
        if (bVar19) goto LAB_0164aacc;
        goto LAB_0164abee;
      }
      if ((uVar2 <= uVar13) ||
         (bVar14 = pcVar15[uVar17 + 1 + uVar2], uVar2 = uVar1, (byte)(bVar14 - 0x30) < 10))
      goto LAB_0164abee;
    }
    if ((bVar14 < 0x21) && ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
      uVar1 = uVar2 + 1;
      uVar2 = uVar1;
      if (uVar1 < uVar7) {
        uVar2 = uVar7;
      }
      goto LAB_0164abba;
    }
    goto LAB_0164abee;
  }
  if ((~(uint)bVar9 / 10 < uVar16) ||
     (((uVar16 = uVar16 * 10 + (uint)bVar9, uVar1 = uVar7, ~uVar2 + uVar5 != uVar17 &&
       (uVar1 = uVar2 + 1, pcVar15[uVar17 + 1 + uVar2] == '_' && local_88 == 0)) &&
      (((uVar5 - uVar2) - 2 == uVar17 ||
       (uVar1 = uVar2 + 2, 9 < (byte)(pcVar15[uVar17 + 2 + uVar2] - 0x30U))))))) goto LAB_0164abee;
  goto LAB_0164a94f;
LAB_0164abba:
  if (uVar7 <= uVar1) goto LAB_0164aacc;
  if ((0x20 < (ulong)(byte)pcVar15[uVar17 + uVar1]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar1] & 0x3f) & 1) == 0)) goto LAB_0164abee;
  uVar1 = uVar1 + 1;
  goto LAB_0164abba;
LAB_0164aacc:
  if (uVar13 < uVar2) goto LAB_0164ab70;
  goto LAB_0164abee;
LAB_0164a7ac:
  if (local_48 <= uVar13) goto joined_r0x0164abe1;
  bVar14 = pcVar15[uVar17 + 1 + uVar13];
  bVar9 = bVar14 | 0x20;
  if (0x19 < (byte)(bVar14 + 0xbf)) {
    bVar9 = bVar14;
  }
  bVar19 = StringUtil::CharacterIsHex(bVar9);
  if (!bVar19) goto LAB_0164abee;
  uVar12 = 0xd0;
  if ('`' < (char)bVar9) {
    uVar12 = 0xa9;
  }
  uVar7 = local_48;
  if ((uVar5 - uVar13) - 2 != uVar17) {
    if (pcVar15[uVar17 + 2 + uVar13] == '_') {
      local_4c = uVar12;
      if (((uVar5 - uVar13) - 3 == uVar17) ||
         (bVar19 = StringUtil::CharacterIsHex(pcVar15[uVar17 + 3 + uVar13]), !bVar19))
      goto LAB_0164abee;
      uVar7 = uVar13 + 2;
      uVar12 = local_4c;
    }
    else {
      uVar7 = uVar13 + 1;
    }
  }
  uVar6 = (uint)(byte)((char)uVar12 + bVar9);
  if (~uVar6 >> 4 < uVar16) goto LAB_0164abee;
  uVar16 = uVar16 * 0x10 + uVar6;
  uVar13 = uVar7;
  goto LAB_0164a7ac;
joined_r0x0164abe1:
  if (1 < uVar13) {
LAB_0164ab70:
    *local_58 = uVar16;
    return true;
  }
  goto LAB_0164abee;
LAB_0164af2d:
  uVar4 = uVar2;
  if (uVar4 < uVar7) {
    bVar14 = pcVar15[uVar17 + uVar4];
    bVar9 = bVar14 - 0x30;
    if (bVar9 < 10) goto code_r0x0164af4d;
    bVar19 = uVar13 < 2;
    local_78._18_6_ = 0;
    uVar13 = uVar4;
    if (uVar4 <= uVar1 && bVar19) {
      return false;
    }
LAB_0164b162:
    uVar16 = (uint)bVar14;
    if (uVar16 - 9 < 5) {
LAB_0164b171:
      uVar5 = uVar13 + 1;
      uVar13 = uVar5;
      if (uVar5 < uVar7) {
        uVar13 = uVar7;
      }
      for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
        if (0x20 < (ulong)(byte)pcVar15[uVar17 + uVar5]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar5] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0164aee3;
    }
    if ((uVar16 != 0x65) && (uVar16 != 0x45)) {
      if (uVar16 != 0x20) {
        return false;
      }
      goto LAB_0164b171;
    }
    if (uVar13 == 1 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar13 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar15 = pcVar15 + uVar17 + uVar13 + 1;
    iVar18 = ~uVar17 + (uVar5 - uVar13);
    if (*pcVar15 == '-') {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    else {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    if (bVar19 == false) {
      return false;
    }
    bVar19 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                       (&local_78,exponent.result);
    goto joined_r0x0164b1dc;
  }
  bVar19 = uVar13 < 2;
  local_78._18_6_ = 0;
  uVar13 = uVar4;
  if (uVar4 <= uVar1 && bVar19) {
    return false;
  }
  goto LAB_0164aee3;
code_r0x0164af4d:
  uVar2 = ((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10;
  lVar11 = local_78.decimal * 10 + (ulong)bVar9;
  if ((long)uVar2 < local_78.decimal) {
    lVar11 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar2);
  uVar2 = uVar7;
  local_78.decimal = lVar11;
  if ((~uVar4 + uVar5 != uVar17) && (uVar2 = uVar4 + 1, pcVar15[uVar17 + 1 + uVar4] == '_')) {
    if ((uVar5 - uVar4) - 2 == uVar17) {
      return false;
    }
    uVar2 = uVar4 + 2;
    if (9 < (byte)(pcVar15[uVar17 + 2 + uVar4] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0164af2d;
LAB_0164b0b3:
  uVar3 = uVar4;
  if (uVar7 <= uVar3) {
    bVar19 = uVar2 <= uVar1;
    local_78._18_6_ = 0;
    uVar2 = uVar3;
    if (uVar3 <= uVar13 && bVar19) {
      return false;
    }
    goto LAB_0164b069;
  }
  bVar14 = pcVar15[uVar17 + uVar3];
  bVar9 = bVar14 - 0x30;
  if (9 < bVar9) {
    bVar19 = uVar2 <= uVar1;
    local_78._18_6_ = 0;
    uVar2 = uVar3;
    if (uVar3 <= uVar13 && bVar19) {
      return false;
    }
LAB_0164b1f7:
    uVar16 = (uint)bVar14;
    if (uVar16 - 9 < 5) {
LAB_0164b202:
      uVar5 = uVar2 + 1;
      uVar2 = uVar5;
      if (uVar5 < uVar7) {
        uVar2 = uVar7;
      }
      for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
        if (0x20 < (ulong)(byte)pcVar15[uVar17 + uVar5]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar5] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_0164b069;
    }
    if ((uVar16 != 0x65) && (uVar16 != 0x45)) {
      if (uVar16 != 0x20) {
        return false;
      }
      goto LAB_0164b202;
    }
    if (uVar2 == uVar1 || local_88 != 0) {
      return false;
    }
    if (uVar7 <= uVar2 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar15 = pcVar15 + uVar17 + uVar2 + 1;
    iVar18 = ~uVar17 + (uVar5 - uVar2);
    if (*pcVar15 == '-') {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    else {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    if (bVar19 == false) {
      return false;
    }
    bVar19 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                       (&local_78,exponent.result);
    goto joined_r0x0164b1dc;
  }
  uVar4 = ((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10;
  lVar11 = local_78.decimal * 10 + (ulong)bVar9;
  if ((long)uVar4 < local_78.decimal) {
    lVar11 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar4);
  uVar4 = uVar7;
  local_78.decimal = lVar11;
  if ((~uVar3 + uVar5 != uVar17) && (uVar4 = uVar3 + 1, pcVar15[uVar17 + 1 + uVar3] == '_')) {
    if ((uVar5 - uVar3) - 2 == uVar17) {
      return false;
    }
    uVar4 = uVar3 + 2;
    if (9 < (byte)(pcVar15[uVar17 + 2 + uVar3] - 0x30U)) {
      return false;
    }
  }
  goto LAB_0164b0b3;
  while (lVar11 = uVar17 + uVar7, uVar7 = uVar7 + 1, pcVar15[lVar11] == '0') {
LAB_0164a735:
    if (uVar1 <= uVar7) {
      uVar16 = 0;
      uVar7 = 1;
      goto LAB_0164a89f;
    }
  }
LAB_0164abee:
  uVar17 = 0;
  while( true ) {
    uVar7 = uVar5 - uVar17;
    if (uVar7 == 0) {
      return false;
    }
    bVar14 = pcVar15[uVar17];
    if ((0x20 < (ulong)bVar14) || ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) == 0)) break;
    uVar17 = uVar17 + 1;
  }
  local_78._16_8_ = 0;
  local_78.result = 0;
  local_78.decimal = 0;
  if (bVar14 == 0x2d) {
    uVar1 = 1;
    while (uVar1 < uVar7) {
      lVar11 = uVar17 + uVar1;
      uVar1 = uVar1 + 1;
      if (pcVar15[lVar11] != '0') {
        return false;
      }
    }
    local_78.result = 0;
    uVar1 = 1;
    while (uVar13 = uVar1, uVar13 < uVar7) {
      bVar14 = pcVar15[uVar17 + uVar13];
      bVar9 = bVar14 - 0x30;
      if (9 < bVar9) {
        if (bVar14 != 0x2e) goto LAB_0164b162;
        if (local_88 != 0) {
          return false;
        }
        uVar1 = uVar13 + 1;
        local_78.decimal_digits = 0;
        uVar2 = uVar1;
        local_78.decimal = 0;
        goto LAB_0164af2d;
      }
      uVar1 = (0x8000000000000000 - (ulong)bVar9) / 10;
      if (SBORROW8(local_78.result,-uVar1) != (long)(local_78.result + uVar1) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar9;
      uVar1 = uVar7;
      if ((~uVar13 + uVar5 != uVar17) &&
         (uVar1 = uVar13 + 1, pcVar15[uVar17 + 1 + uVar13] == '_' && local_88 == 0)) {
        if ((uVar5 - uVar13) - 2 == uVar17) {
          return false;
        }
        uVar1 = uVar13 + 2;
        if (9 < (byte)(pcVar15[uVar17 + 2 + uVar13] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0164aee3:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>(&local_78);
    if (!bVar19) {
      return false;
    }
    if (uVar13 < 2) {
      return false;
    }
    goto LAB_0164b1e2;
  }
  if ((uVar5 - 1 == uVar17) || (bVar14 != 0x30)) {
    if ((local_88 & bVar14 == 0x2b) != 0) {
      return false;
    }
    uVar1 = (ulong)(bVar14 == 0x2b);
LAB_0164ae3a:
    local_78.result = 0;
    uVar13 = uVar1;
    while (uVar2 = uVar13, uVar2 < uVar7) {
      bVar14 = pcVar15[uVar17 + uVar2];
      bVar9 = bVar14 - 0x30;
      if (9 < bVar9) {
        if (bVar14 != 0x2e) goto LAB_0164b1f7;
        if (local_88 != 0) {
          return false;
        }
        uVar13 = uVar2 + 1;
        local_78.decimal_digits = 0;
        uVar4 = uVar13;
        local_78.decimal = 0;
        goto LAB_0164b0b3;
      }
      if ((long)(((ulong)bVar9 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar9;
      uVar13 = uVar7;
      if ((~uVar2 + uVar5 != uVar17) &&
         (uVar13 = uVar2 + 1, pcVar15[uVar17 + 1 + uVar2] == '_' && local_88 == 0)) {
        if ((uVar5 - uVar2) - 2 == uVar17) {
          return false;
        }
        uVar13 = uVar2 + 2;
        if (9 < (byte)(pcVar15[uVar17 + 2 + uVar2] - 0x30U)) {
          return false;
        }
      }
    }
LAB_0164b069:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_78);
    if (!bVar19) {
      return false;
    }
    if (uVar2 <= uVar1) {
      return false;
    }
    goto LAB_0164b1e2;
  }
  cVar10 = pcVar15[uVar17 + 1];
  if (cVar10 == 'B') {
LAB_0164afc6:
    local_78.result = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar17 + uVar5) {
      uVar1 = 0;
      if ((pcVar15[uVar17 + 1 + uVar7] != '0') && (uVar1 = 1, pcVar15[uVar17 + 1 + uVar7] != '1')) {
        return false;
      }
      uVar13 = ~uVar17 + uVar5;
      if ((uVar5 - uVar7) - 2 != uVar17) {
        if (pcVar15[uVar17 + 2 + uVar7] == '_') {
          if ((uVar5 - uVar7) - 3 == uVar17) {
            return false;
          }
          if ((pcVar15[uVar17 + 3 + uVar7] & 0xfeU) != 0x30) {
            return false;
          }
          uVar13 = uVar7 + 2;
        }
        else {
          uVar13 = uVar7 + 1;
        }
      }
      uVar7 = uVar13;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = uVar1 + local_78.result * 2;
    }
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_78);
  }
  else {
    if (cVar10 != 'x') {
      if (cVar10 == 'b') goto LAB_0164afc6;
      if (cVar10 != 'X') {
        if ((local_88 & (byte)(cVar10 - 0x30U) < 10) != 0) {
          return false;
        }
        uVar1 = 0;
        goto LAB_0164ae3a;
      }
    }
    lVar11 = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar17 + uVar5) {
      bVar14 = pcVar15[uVar17 + 1 + uVar7];
      bVar9 = bVar14 | 0x20;
      if (0x19 < (byte)(bVar14 + 0xbf)) {
        bVar9 = bVar14;
      }
      bVar19 = StringUtil::CharacterIsHex(bVar9);
      if (!bVar19) {
        return false;
      }
      cVar10 = -0x30;
      if ('`' < (char)bVar9) {
        cVar10 = -0x57;
      }
      uVar1 = ~uVar17 + uVar5;
      if ((uVar5 - uVar7) - 2 != uVar17) {
        if (pcVar15[uVar17 + 2 + uVar7] == '_') {
          if ((uVar5 - uVar7) - 3 == uVar17) {
            return false;
          }
          bVar19 = StringUtil::CharacterIsHex(pcVar15[uVar17 + 3 + uVar7]);
          if (!bVar19) {
            return false;
          }
          uVar1 = uVar7 + 2;
        }
        else {
          uVar1 = uVar7 + 1;
        }
      }
      if ((long)((ulong)((byte)(cVar10 + bVar9) >> 4) ^ 0x7ffffffffffffff) < lVar11) {
        return false;
      }
      lVar11 = lVar11 * 0x10 + (ulong)(byte)(cVar10 + bVar9);
      uVar7 = uVar1;
    }
    local_78.result = lVar11;
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_78);
  }
  bVar19 = (bool)(1 < uVar7 & bVar19);
joined_r0x0164b1dc:
  if (bVar19 == false) {
    return false;
  }
LAB_0164b1e2:
  *local_58 = (uint)local_78.result;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, uint32_t &result, bool strict) {
	return TrySimpleIntegerCast<uint32_t, false>(input.GetData(), input.GetSize(), result, strict);
}